

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

void inf_chksum(zng_stream *strm,uint8_t *src,uint32_t len)

{
  internal_state *piVar1;
  uint32_t uVar2;
  
  piVar1 = strm->state;
  if (piVar1->pending_buf_size != 0) {
    (*functable.crc32_fold)((crc32_fold_s *)&piVar1->level,src,(size_t)len,0);
    return;
  }
  uVar2 = (*functable.adler32)(piVar1->wrap,src,(size_t)len);
  piVar1->wrap = (int)(ulong)uVar2;
  piVar1->gzindex = (int)((ulong)uVar2 >> 0x20);
  strm->adler = uVar2;
  return;
}

Assistant:

static inline void inf_chksum(PREFIX3(stream) *strm, const uint8_t *src, uint32_t len) {
    struct inflate_state *state = (struct inflate_state*)strm->state;
#ifdef GUNZIP
    if (state->flags) {
        FUNCTABLE_CALL(crc32_fold)(&state->crc_fold, src, len, 0);
    } else
#endif
    {
        strm->adler = state->check = FUNCTABLE_CALL(adler32)(state->check, src, len);
    }
}